

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
TryEmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(TryEmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  iterator i;
  const_iterator cVar1;
  iterator i_00;
  const_iterator cVar2;
  bool bVar3;
  reference ppVar4;
  char *pcVar5;
  AssertHelper local_678;
  Message local_670;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_1;
  const_iterator local_620;
  iterator local_5f0;
  Generator<int,_void> local_5bd;
  int local_5bc;
  undefined1 local_5b8 [8];
  T val2;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_540;
  const_iterator local_538;
  undefined1 auStack_508 [8];
  iterator it;
  undefined1 local_4c8 [8];
  TypeParam m;
  undefined1 local_40 [8];
  T val;
  TryEmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  val._40_8_ = this;
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)local_40,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x1f));
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)local_4c8);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::end((iterator *)&gtest_ar.message_,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
         *)local_4c8);
  i.inner_end_ = (Inner *)uStack_560;
  i.inner_ = (Inner *)gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
  i.it_.ctrl_ = (ctrl_t *)local_558;
  i.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)uStack_550;
  i.it_end_.ctrl_ = (ctrl_t *)local_548;
  i.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)aStack_540.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::const_iterator::const_iterator(&local_538,i);
  cVar1.iter_.inner_end_ = local_538.iter_.inner_end_;
  cVar1.iter_.inner_ = local_538.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_538.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_538.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_538.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_538.iter_.it_end_.field_1.slot_;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::try_emplace<phmap::priv::NonStandardLayout,int&>
            ((iterator *)auStack_508,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)local_4c8,cVar1,(key_arg<phmap::priv::NonStandardLayout> *)local_40,
             (int *)(val.first.value.field_2._M_local_buf + 8));
  ppVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ::iterator::operator*((iterator *)auStack_508);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::pair<const_phmap::priv::NonStandardLayout,_int>,_nullptr>
            ((EqHelper *)local_578,"val","*it",
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_40,ppVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar3) {
    testing::Message::Message(&local_580);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&val2.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xb9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&val2.second,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&val2.second);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  local_5bc = hash_internal::Generator<int,_void>::operator()(&local_5bd);
  std::pair<const_phmap::priv::NonStandardLayout,_int>::pair<int,_true>
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)local_5b8,
             (NonStandardLayout *)local_40,&local_5bc);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_508;
  i_00.inner_end_ = it.inner_;
  i_00.inner_ = (Inner *)auStack_508;
  i_00.it_.ctrl_ = (ctrl_t *)it.inner_end_;
  i_00.it_.field_1.slot_ = (slot_type *)it.it_.ctrl_;
  i_00.it_end_.ctrl_ = (ctrl_t *)it.it_.field_1.slot_;
  i_00.it_end_.field_1.slot_ = (slot_type *)it.it_end_.ctrl_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::const_iterator::const_iterator(&local_620,i_00);
  cVar2.iter_.inner_end_ = local_620.iter_.inner_end_;
  cVar2.iter_.inner_ = local_620.iter_.inner_;
  cVar2.iter_.it_.ctrl_ = local_620.iter_.it_.ctrl_;
  cVar2.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_620.iter_.it_.field_1.slot_;
  cVar2.iter_.it_end_.ctrl_ = local_620.iter_.it_end_.ctrl_;
  cVar2.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_620.iter_.it_end_.field_1.slot_;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::try_emplace<phmap::priv::NonStandardLayout,int&>
            (&local_5f0,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)local_4c8,cVar2,(key_arg<phmap::priv::NonStandardLayout> *)local_5b8,
             (int *)(val2.first.value.field_2._M_local_buf + 8));
  it.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_5f0.it_end_.ctrl_;
  it.it_end_.ctrl_ = (ctrl_t *)local_5f0.it_end_.field_1.slot_;
  it.inner_end_ = (Inner *)local_5f0.it_.ctrl_;
  it.it_.ctrl_ = (ctrl_t *)local_5f0.it_.field_1.slot_;
  auStack_508 = (undefined1  [8])local_5f0.inner_;
  it.inner_ = local_5f0.inner_end_;
  ppVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ::iterator::operator*((iterator *)auStack_508);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::pair<const_phmap::priv::NonStandardLayout,_int>,_nullptr>
            ((EqHelper *)local_668,"val","*it",
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_40,ppVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar3) {
    testing::Message::Message(&local_670);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)local_5b8);
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)local_4c8);
  std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)local_40);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, TryEmplaceHint) {
#ifdef UNORDERED_MAP_CXX17
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.try_emplace(m.end(), val.first, val.second);
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.try_emplace(it, val2.first, val2.second);
  EXPECT_EQ(val, *it);
#endif
}